

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O0

int CVBBDPrecInit(void *cvode_mem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                 sunindextype mukeep,sunindextype mlkeep,sunrealtype dqrely,CVLocalFn gloc,
                 CVCommFn cfn)

{
  int iVar1;
  long ml;
  SUNMatrix p_Var2;
  SUNContext_conflict sunctx;
  N_Vector p_Var3;
  long lVar4;
  SUNLinearSolver p_Var5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  CVodeMem in_RDI;
  sunindextype in_R8;
  SUNContext_conflict in_R9;
  double in_XMM0_Qa;
  long in_stack_00000008;
  long in_stack_00000010;
  int flag;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype storage_mu;
  sunindextype mlk;
  sunindextype muk;
  CVBBDPrecData pdata;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  double local_130;
  SUNContext_conflict in_stack_fffffffffffffed8;
  SUNContext_conflict in_stack_fffffffffffffee8;
  SUNContext_conflict sunctx_00;
  SUNContext_conflict cvode_mem_00;
  sunindextype in_stack_ffffffffffffff08;
  long local_e8;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  SUNContext_conflict local_70;
  SUNContext_conflict local_68;
  long local_60;
  long *local_58;
  void *pvVar6;
  CVodeMem cv_mem_00;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x45,"CVBBDPrecInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0x4e,"CVBBDPrecInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,
                   "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                  );
    local_4 = -2;
  }
  else {
    pvVar6 = in_RDI->cv_lmem;
    if (in_RDI->cv_tempv->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0) {
      cvProcessError(in_RDI,-3,0x57,"CVBBDPrecInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                     ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else {
      local_58 = (long *)0x0;
      cv_mem_00 = in_RDI;
      local_58 = (long *)malloc(0xa0);
      if (local_58 == (long *)0x0) {
        cvProcessError(cv_mem_00,-4,0x61,"CVBBDPrecInit",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                       ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        local_58[0x13] = (long)in_RDI;
        local_58[5] = in_stack_00000008;
        local_58[6] = in_stack_00000010;
        local_a8 = in_RDX;
        if (in_RDX < 0) {
          local_a8 = 0;
        }
        if (in_RSI + -1 < local_a8) {
          local_b0 = in_RSI + -1;
        }
        else {
          local_b8 = in_RDX;
          if (in_RDX < 0) {
            local_b8 = 0;
          }
          local_b0 = local_b8;
        }
        *local_58 = local_b0;
        local_c8 = in_RCX;
        if (in_RCX < 0) {
          local_c8 = 0;
        }
        if (in_RSI + -1 < local_c8) {
          local_d0 = in_RSI + -1;
        }
        else {
          local_d8 = in_RCX;
          if (in_RCX < 0) {
            local_d8 = 0;
          }
          local_d0 = local_d8;
        }
        local_58[1] = local_d0;
        local_e8 = in_R8;
        if (in_R8 < 0) {
          local_e8 = 0;
        }
        if (in_RSI + -1 < local_e8) {
          in_R8 = in_stack_ffffffffffffff08;
          lVar4 = in_RSI + -1;
        }
        else {
          lVar4 = in_R8;
          if (in_R8 < 0) {
            in_R8 = 0;
            lVar4 = in_R8;
          }
        }
        ml = in_RSI + -1;
        cvode_mem_00 = in_R9;
        if ((long)in_R9 < 0) {
          cvode_mem_00 = (SUNContext_conflict)0x0;
        }
        if (ml < (long)cvode_mem_00) {
          in_R9 = in_stack_fffffffffffffee8;
          sunctx_00 = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          sunctx_00 = in_R9;
          if ((long)in_R9 < 0) {
            in_R9 = (SUNContext_conflict)0x0;
            sunctx_00 = in_R9;
          }
        }
        local_58[2] = lVar4;
        local_58[3] = (long)sunctx_00;
        local_68 = sunctx_00;
        local_60 = lVar4;
        p_Var2 = SUNBandMatrixStorage(lVar4,in_R8,ml,(sunindextype)cvode_mem_00,sunctx_00);
        local_58[7] = (long)p_Var2;
        if (local_58[7] == 0) {
          free(local_58);
          local_58 = (long *)0x0;
          cvProcessError(cv_mem_00,-4,0x77,"CVBBDPrecInit",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                         ,"A memory request failed.");
          local_4 = -4;
        }
        else {
          if (in_RSI + -1 < (long)&local_68->profiler + local_60) {
            sunctx = (SUNContext_conflict)(in_RSI + -1);
          }
          else {
            sunctx = (SUNContext_conflict)((long)&local_68->profiler + local_60);
          }
          local_58[8] = 0;
          local_70 = sunctx;
          p_Var2 = SUNBandMatrixStorage(lVar4,in_R8,ml,(sunindextype)cvode_mem_00,sunctx_00);
          local_58[8] = (long)p_Var2;
          if (local_58[8] == 0) {
            SUNMatDestroy(local_58[7]);
            free(local_58);
            local_58 = (long *)0x0;
            cvProcessError(cv_mem_00,-4,0x86,"CVBBDPrecInit",
                           "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                           ,"A memory request failed.");
            local_4 = -4;
          }
          else {
            local_58[0xd] = 0;
            p_Var3 = N_VNewEmpty_Serial((sunindextype)sunctx,in_stack_fffffffffffffed8);
            local_58[0xd] = (long)p_Var3;
            if (local_58[0xd] == 0) {
              SUNMatDestroy(local_58[8]);
              SUNMatDestroy(local_58[7]);
              free(local_58);
              local_58 = (long *)0x0;
              cvProcessError(cv_mem_00,-4,0x94,"CVBBDPrecInit",
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                             ,"A memory request failed.");
              local_4 = -4;
            }
            else {
              local_58[0xe] = 0;
              p_Var3 = N_VNewEmpty_Serial((sunindextype)sunctx,in_stack_fffffffffffffed8);
              local_58[0xe] = (long)p_Var3;
              if (local_58[0xe] == 0) {
                N_VDestroy(local_58[0xd]);
                SUNMatDestroy(local_58[8]);
                SUNMatDestroy(local_58[7]);
                free(local_58);
                local_58 = (long *)0x0;
                cvProcessError(cv_mem_00,-4,0xa1,"CVBBDPrecInit",
                               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                               ,"A memory request failed.");
                local_4 = -4;
              }
              else {
                local_58[10] = 0;
                lVar4 = N_VClone(cv_mem_00->cv_tempv);
                local_58[10] = lVar4;
                if (local_58[10] == 0) {
                  N_VDestroy(local_58[0xd]);
                  N_VDestroy(local_58[0xe]);
                  SUNMatDestroy(local_58[8]);
                  SUNMatDestroy(local_58[7]);
                  free(local_58);
                  local_58 = (long *)0x0;
                  cvProcessError(cv_mem_00,-4,0xaf,"CVBBDPrecInit",
                                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                                 ,"A memory request failed.");
                  local_4 = -4;
                }
                else {
                  local_58[0xb] = 0;
                  lVar4 = N_VClone(cv_mem_00->cv_tempv);
                  local_58[0xb] = lVar4;
                  if (local_58[0xb] == 0) {
                    N_VDestroy(local_58[10]);
                    N_VDestroy(local_58[0xd]);
                    N_VDestroy(local_58[0xe]);
                    SUNMatDestroy(local_58[8]);
                    SUNMatDestroy(local_58[7]);
                    free(local_58);
                    local_58 = (long *)0x0;
                    cvProcessError(cv_mem_00,-4,0xbe,"CVBBDPrecInit",
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                                   ,"A memory request failed.");
                    local_4 = -4;
                  }
                  else {
                    local_58[0xc] = 0;
                    lVar4 = N_VClone(cv_mem_00->cv_tempv);
                    local_58[0xc] = lVar4;
                    if (local_58[0xc] == 0) {
                      N_VDestroy(local_58[10]);
                      N_VDestroy(local_58[0xb]);
                      N_VDestroy(local_58[0xd]);
                      N_VDestroy(local_58[0xe]);
                      SUNMatDestroy(local_58[8]);
                      SUNMatDestroy(local_58[7]);
                      free(local_58);
                      local_58 = (long *)0x0;
                      cvProcessError(cv_mem_00,-4,0xce,"CVBBDPrecInit",
                                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                                     ,"A memory request failed.");
                      local_4 = -4;
                    }
                    else {
                      local_58[9] = 0;
                      p_Var5 = SUNLinSol_Band((N_Vector)sunctx_00,(SUNMatrix)in_R9,sunctx);
                      local_58[9] = (long)p_Var5;
                      if (local_58[9] == 0) {
                        N_VDestroy(local_58[10]);
                        N_VDestroy(local_58[0xb]);
                        N_VDestroy(local_58[0xc]);
                        N_VDestroy(local_58[0xd]);
                        N_VDestroy(local_58[0xe]);
                        SUNMatDestroy(local_58[8]);
                        SUNMatDestroy(local_58[7]);
                        free(local_58);
                        local_58 = (long *)0x0;
                        cvProcessError(cv_mem_00,-4,0xe1,"CVBBDPrecInit",
                                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                                       ,"A memory request failed.");
                        local_4 = -4;
                      }
                      else {
                        local_130 = in_XMM0_Qa;
                        iVar1 = SUNLinSolInitialize(local_58[9]);
                        if (iVar1 == 0) {
                          if (local_130 <= 0.0) {
                            if (0.0 < cv_mem_00->cv_uround) {
                              local_130 = sqrt(cv_mem_00->cv_uround);
                            }
                            else {
                              local_130 = 0.0;
                            }
                          }
                          local_58[4] = (long)local_130;
                          local_58[0xf] = in_RSI;
                          local_58[0x10] = 0;
                          local_58[0x11] = 0;
                          if (cv_mem_00->cv_tempv->ops->nvspace !=
                              (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
                            N_VSpace(cv_mem_00->cv_tempv,&local_78,&local_80);
                            local_58[0x10] = local_78 * 3 + local_58[0x10];
                            local_58[0x11] = local_80 * 3 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[0xe] + 8) + 0x20) != 0) {
                            N_VSpace(local_58[0xe],&local_78,&local_80);
                            local_58[0x10] = local_78 * 2 + local_58[0x10];
                            local_58[0x11] = local_80 * 2 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[7] + 8) + 0x50) != 0) {
                            SUNMatSpace(local_58[7],&local_88,&local_90);
                            local_58[0x10] = local_88 + local_58[0x10];
                            local_58[0x11] = local_90 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[8] + 8) + 0x50) != 0) {
                            SUNMatSpace(local_58[8],&local_88,&local_90);
                            local_58[0x10] = local_88 + local_58[0x10];
                            local_58[0x11] = local_90 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[9] + 8) + 0x60) != 0) {
                            SUNLinSolSpace(local_58[9],&local_88,&local_90);
                            local_58[0x10] = local_88 + local_58[0x10];
                            local_58[0x11] = local_90 + local_58[0x11];
                          }
                          local_58[0x12] = 0;
                          if (*(long *)((long)pvVar6 + 0xe8) != 0) {
                            (**(code **)((long)pvVar6 + 0xe8))(cv_mem_00);
                          }
                          *(long **)((long)pvVar6 + 0xf0) = local_58;
                          *(code **)((long)pvVar6 + 0xe8) = CVBBDPrecFree;
                          local_4 = CVodeSetPreconditioner
                                              (cvode_mem_00,(CVLsPrecSetupFn)sunctx_00,
                                               (CVLsPrecSolveFn)in_R9);
                        }
                        else {
                          N_VDestroy(local_58[10]);
                          N_VDestroy(local_58[0xb]);
                          N_VDestroy(local_58[0xc]);
                          N_VDestroy(local_58[0xd]);
                          N_VDestroy(local_58[0xe]);
                          SUNMatDestroy(local_58[8]);
                          SUNMatDestroy(local_58[7]);
                          SUNLinSolFree(local_58[9]);
                          free(local_58);
                          local_58 = (long *)0x0;
                          cvProcessError(cv_mem_00,-9,0xf4,"CVBBDPrecInit",
                                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                                         ,"An error arose from a SUNBandLinearSolver routine.");
                          local_4 = -9;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int CVBBDPrecInit(void* cvode_mem, sunindextype Nlocal, sunindextype mudq,
                  sunindextype mldq, sunindextype mukeep, sunindextype mlkeep,
                  sunrealtype dqrely, CVLocalFn gloc, CVCommFn cfn)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if the CVLS linear solver interface has been created */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  if (cv_mem->cv_tempv->ops->nvgetarraypointer == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGBBD_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (CVBBDPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Set pointers to gloc and cfn; load half-bandwidths */
  pdata->cvode_mem = cvode_mem;
  pdata->gloc      = gloc;
  pdata->cfn       = cfn;
  pdata->mudq      = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq      = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));
  muk              = SUNMIN(Nlocal - 1, SUNMAX(0, mukeep));
  mlk              = SUNMIN(Nlocal - 1, SUNMAX(0, mlkeep));
  pdata->mukeep    = muk;
  pdata->mlkeep    = mlk;

  /* Allocate memory for saved Jacobian */
  pdata->savedJ = SUNBandMatrixStorage(Nlocal, muk, mlk, muk, cv_mem->cv_sunctx);
  if (pdata->savedJ == NULL)
  {
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for preconditioner matrix */
  storage_mu    = SUNMIN(Nlocal - 1, muk + mlk);
  pdata->savedP = NULL;
  pdata->savedP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu,
                                       cv_mem->cv_sunctx);
  if (pdata->savedP == NULL)
  {
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */
  pdata->zlocal = NULL;
  pdata->zlocal = N_VNewEmpty_Serial(Nlocal, cv_mem->cv_sunctx);
  if (pdata->zlocal == NULL)
  {
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal, cv_mem->cv_sunctx);
  if (pdata->rlocal == NULL)
  {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->tmp1 = NULL;
  pdata->tmp1 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp1 == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->tmp2 = NULL;
  pdata->tmp2 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp2 == NULL)
  {
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->tmp3 = NULL;
  pdata->tmp3 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp3 == NULL)
  {
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->tmp2);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->rlocal, pdata->savedP, cv_mem->cv_sunctx);
  if (pdata->LS == NULL)
  {
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->tmp2);
    N_VDestroy(pdata->tmp3);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUN_SUCCESS)
  {
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->tmp2);
    N_VDestroy(pdata->tmp3);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    SUNLinSolFree(pdata->LS);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_SUNLS_FAIL);
    return (CVLS_SUNLS_FAIL);
  }

  /* Set pdata->dqrely based on input dqrely (0 implies default). */
  pdata->dqrely = (dqrely > ZERO) ? dqrely : SUNRsqrt(cv_mem->cv_uround);

  /* Store Nlocal to be used in CVBBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (cv_mem->cv_tempv->ops->nvspace)
  {
    N_VSpace(cv_mem->cv_tempv, &lrw1, &liw1);
    pdata->rpwsize += 3 * lrw1;
    pdata->ipwsize += 3 * liw1;
  }
  if (pdata->rlocal->ops->nvspace)
  {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += 2 * lrw1;
    pdata->ipwsize += 2 * liw1;
  }
  if (pdata->savedJ->ops->space)
  {
    flag = SUNMatSpace(pdata->savedJ, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->savedP->ops->space)
  {
    flag = SUNMatSpace(pdata->savedP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space)
  {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure P_data is free from any previous allocations */
  if (cvls_mem->pfree) { cvls_mem->pfree(cv_mem); }

  /* Point to the new P_data field in the LS memory */
  cvls_mem->P_data = pdata;

  /* Attach the pfree function */
  cvls_mem->pfree = CVBBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = CVodeSetPreconditioner(cvode_mem, CVBBDPrecSetup, CVBBDPrecSolve);
  return (flag);
}